

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_dump_console.c
# Opt level: O2

void linkedlist_dump_console
               (s_linkedlist *linked_list,_func_char_ptr_void_ptr *fun_render_node_element)

{
  char *__ptr;
  s_linkedlist_node *psVar1;
  
  psVar1 = linked_list->head;
  printf("linkedlist<0x%p>\n",linked_list);
  for (; psVar1 != (s_linkedlist_node *)0x0; psVar1 = psVar1->next) {
    if (fun_render_node_element == (_func_char_ptr_void_ptr *)0x0) {
      printf(" + node<0x%p> = element<0x%p>\n",psVar1);
    }
    else {
      __ptr = (*fun_render_node_element)(psVar1->element);
      printf(" + node<0x%p> = %s\n",psVar1,__ptr);
      free(__ptr);
    }
  }
  return;
}

Assistant:

void linkedlist_dump_console(s_linkedlist *linked_list, char *(*fun_render_node_element)(void *)) {
    s_linkedlist_node *node = linked_list->head;

    printf("linkedlist<0x%p>\n", linked_list);
    while (node != NULL) {
        if (fun_render_node_element != NULL) {
            char *element = fun_render_node_element(node->element);
            printf(" + node<0x%p> = %s\n", node, element);

            if (element != NULL) {
                free(element);
            }
        } else {
            printf(" + node<0x%p> = element<0x%p>\n", node, node->element);
        }

        node = node->next;
    }
}